

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_ReadHttpResponse(void *Handle,char *buf,size_t *size,int timeout)

{
  bool bVar1;
  parse_status_t pVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  char tempbuf [2048];
  int local_84c;
  http_parser_t *local_848;
  membuffer *local_840;
  char local_838 [2056];
  
  if ((size == (size_t *)0x0 || Handle == (void *)0x0) || ((buf == (char *)0x0 && (*size != 0)))) {
    uVar3 = 0xffffff9b;
    if (size != (size_t *)0x0) {
LAB_0010f45e:
      *size = 0;
    }
  }
  else {
    pVar2 = PARSE_SUCCESS;
    local_84c = timeout;
    if (*(int *)((long)Handle + 0x248) != 4) {
      pVar2 = parser_parse_entity((http_parser_t *)((long)Handle + 0x90));
    }
    if ((pVar2 < (PARSE_CONTINUE_1|PARSE_INCOMPLETE)) && ((0x47U >> (pVar2 & 0x1f) & 1) != 0)) {
      lVar5 = *(long *)((long)Handle + 400);
      uVar6 = *(ulong *)((long)Handle + 0x210);
      bVar1 = uVar6 < *size + lVar5;
      if ((uVar6 < *size + lVar5) && (*(int *)((long)Handle + 0x284) == 0)) {
        local_840 = (membuffer *)((long)Handle + 0x218);
        iVar7 = *(int *)(&DAT_0012b300 + (ulong)pVar2 * 4);
        local_848 = (http_parser_t *)((long)Handle + 0x90);
        while (*(int *)((long)Handle + 0x248) != 4) {
          uVar3 = sock_read((SOCKINFO *)Handle,local_838,0x800,&local_84c);
          if ((int)uVar3 < 1) {
            if (uVar3 != 0) goto LAB_0010f45e;
            if (iVar7 == 0) {
              *size = 0;
              *(undefined4 *)((long)Handle + 0x240) = 400;
              return -0x77;
            }
            UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x612,
                       "<<< (RECVD) <<<\n%s\n-----------------\n",
                       *(undefined8 *)((long)Handle + 0x218));
            *(undefined4 *)((long)Handle + 0x248) = 4;
            iVar4 = 1;
          }
          else {
            iVar4 = membuffer_append(local_840,local_838,(ulong)uVar3);
            if (iVar4 != 0) {
              *(undefined4 *)((long)Handle + 0x240) = 500;
              *size = 0;
              return 3;
            }
            pVar2 = parser_parse_entity(local_848);
            iVar4 = iVar7;
            if (((PARSE_INCOMPLETE < pVar2) && (iVar4 = 1, pVar2 != PARSE_INCOMPLETE_ENTITY)) &&
               (iVar4 = iVar7, pVar2 != PARSE_CONTINUE_1)) goto LAB_0010f640;
          }
          iVar7 = iVar4;
          lVar5 = *(long *)((long)Handle + 400);
          uVar6 = *(ulong *)((long)Handle + 0x210);
          bVar1 = uVar6 < *size + lVar5;
          if ((*size + lVar5 <= uVar6) || (*(int *)((long)Handle + 0x284) != 0)) break;
        }
      }
      uVar3 = 0xffffff2e;
      if (*(int *)((long)Handle + 0x284) == 0) {
        if (bVar1) {
          *size = uVar6 - lVar5;
        }
        uVar3 = 0;
        if (*size != 0) {
          memcpy(buf,(void *)(*(long *)((long)Handle + 0x218) + *(long *)((long)Handle + 0x260)),
                 *size);
          membuffer_delete((membuffer *)((long)Handle + 0x218),*(size_t *)((long)Handle + 0x260),
                           *size);
          *(long *)((long)Handle + 0x270) = *(long *)((long)Handle + 0x270) - *size;
          *(long *)((long)Handle + 400) = *(long *)((long)Handle + 400) + *size;
          uVar3 = 0;
        }
      }
    }
    else {
LAB_0010f640:
      *size = 0;
      uVar3 = 0xffffff8f;
    }
  }
  return uVar3;
}

Assistant:

int http_ReadHttpResponse(void *Handle, char *buf, size_t *size, int timeout)
{
	http_connection_handle_t *handle = Handle;
	parse_status_t status;
	int num_read;
	int ok_on_close = 0;
	char tempbuf[2 * 1024];
	int ret_code = 0;

	if (!handle || !size || (*size > 0 && !buf)) {
		if (size)
			*size = 0;
		return UPNP_E_INVALID_PARAM;
	}
	/* first parse what has already been gotten */
	if (handle->response.position != POS_COMPLETE)
		status = parser_parse_entity(&handle->response);
	else
		status = PARSE_SUCCESS;
	if (status == PARSE_INCOMPLETE_ENTITY)
		/* read until close */
		ok_on_close = 1;
	else if ((status != PARSE_SUCCESS) && (status != PARSE_CONTINUE_1) &&
		 (status != PARSE_INCOMPLETE)) {
		/*error */
		*size = 0;
		return UPNP_E_BAD_RESPONSE;
	}
	/* read more if necessary entity */
	while (handle->response.msg.amount_discarded + *size >
			handle->response.msg.entity.length &&
		!handle->cancel && handle->response.position != POS_COMPLETE) {
		num_read = sock_read(
			&handle->sock_info, tempbuf, sizeof(tempbuf), &timeout);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(&handle->response.msg.msg,
				tempbuf,
				(size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				handle->response.http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				*size = 0;
				return PARSE_FAILURE;
			}
			status = parser_parse_entity(&handle->response);
			if (status == PARSE_INCOMPLETE_ENTITY) {
				/* read until close */
				ok_on_close = 1;
			} else if ((status != PARSE_SUCCESS) &&
				   (status != PARSE_CONTINUE_1) &&
				   (status != PARSE_INCOMPLETE)) {
				/*error */
				*size = 0;
				return UPNP_E_BAD_RESPONSE;
			}
		} else if (num_read == 0) {
			if (ok_on_close) {
				UpnpPrintf(UPNP_INFO,
					HTTP,
					__FILE__,
					__LINE__,
					"<<< (RECVD) "
					"<<<\n%s\n-----------------\n",
					handle->response.msg.msg.buf);
				handle->response.position = POS_COMPLETE;
			} else {
				/* partial msg */
				*size = 0;
				handle->response.http_error_code =
					HTTP_BAD_REQUEST; /* or response */
				return UPNP_E_BAD_HTTPMSG;
			}
		} else {
			*size = 0;
			return num_read;
		}
	}
	if (handle->cancel) {
		return UPNP_E_CANCELED;
	}
	/* truncate size to fall within available data */
	if (handle->response.msg.amount_discarded + *size >
		handle->response.msg.entity.length)
		*size = handle->response.msg.entity.length -
			handle->response.msg.amount_discarded;
	/* copy data to user buffer. delete copied data */
	if (*size > 0) {
		memcpy(buf,
			&handle->response.msg.msg
				.buf[handle->response.entity_start_position],
			*size);
		membuffer_delete(&handle->response.msg.msg,
			handle->response.entity_start_position,
			*size);
		/* update scanner position. needed for chunked transfers */
		handle->response.scanner.cursor -= *size;
		/* update amount discarded */
		handle->response.msg.amount_discarded += *size;
	}

	return UPNP_E_SUCCESS;
}